

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verification_utils.hpp
# Opt level: O1

void __thiscall boost::certify::store_ctx::set_server_hostname(store_ctx *this,string_view hostname)

{
  int iVar1;
  X509_VERIFY_PARAM *pXVar2;
  ulong uVar3;
  ulong uVar4;
  system_error_category *psVar5;
  char cVar6;
  undefined **local_60 [2];
  ulong local_50;
  error_category *local_48;
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  pXVar2 = X509_STORE_CTX_get0_param
                     ((X509_STORE_CTX *)
                      (this->handle_)._M_t.
                      super___uniq_ptr_impl<x509_store_ctx_st,_boost::certify::store_ctx::free>._M_t
                      .super__Tuple_impl<0UL,_x509_store_ctx_st_*,_boost::certify::store_ctx::free>.
                      super__Head_base<0UL,_x509_store_ctx_st_*,_false>._M_head_impl);
  X509_VERIFY_PARAM_set_hostflags(pXVar2,4);
  iVar1 = X509_VERIFY_PARAM_set1_host(pXVar2,hostname.ptr_,hostname.len_);
  if (iVar1 == 0) {
    uVar3 = ERR_get_error();
    if ((DAT_0010a250 == -0x4d54ee85da8120f3) || (DAT_0010a250 == -0x70502de1da3a1f65)) {
      cVar6 = (int)uVar3 != 0;
    }
    else {
      cVar6 = (**(code **)(asio::error::get_ssl_category()::instance + 0x30))
                        (&asio::error::get_ssl_category()::instance,uVar3 & 0xffffffff);
    }
    uVar4 = 0;
    if (cVar6 != '\0') {
      uVar4 = 0x100000000;
    }
    uVar4 = uVar4 | uVar3 & 0xffffffff;
    psVar5 = (system_error_category *)&asio::error::get_ssl_category()::instance;
  }
  else {
    psVar5 = &system::detail::cat_holder<void>::system_category_instance;
    uVar4 = 0;
  }
  if ((uVar4 & 0x100000000) == 0) {
    return;
  }
  std::runtime_error::runtime_error((runtime_error *)local_60,"");
  local_60[0] = &PTR__system_error_00109a58;
  local_40._M_p = (pointer)&local_30;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_50 = uVar4;
  local_48 = &psVar5->super_error_category;
  throw_exception<boost::system::system_error>((system_error *)local_60);
}

Assistant:

void set_server_hostname(string_view hostname)
    {
        auto* param = ::X509_STORE_CTX_get0_param(handle_.get());
        system::error_code ec;
        detail::set_server_hostname(param, hostname, ec);
        if (ec)
            boost::throw_exception(system::system_error{ec});
    }